

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::iterate(GLPositionCase *this)

{
  string *this_00;
  deUint32 program;
  TestLog *log;
  RenderContext *context;
  Archive *archive;
  bool bVar1;
  int iVar2;
  deUint32 seed;
  undefined4 extraout_var;
  long lVar3;
  int in_R9D;
  TextureLevel reference;
  Surface pixels;
  ConstPixelBufferAccess local_218;
  RandomViewport viewport;
  ConstPixelBufferAccess local_1e0;
  VertexArrayBinding bindings [1];
  undefined4 extraout_var_00;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[4])(context);
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar2),0x100,0x100,seed);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var_00,iVar2);
  program = (((this->m_program).m_ptr)->m_program).m_program;
  (**(code **)(lVar3 + 0x1680))(program);
  (**(code **)(lVar3 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar3 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar3 + 0x188))(0x4000);
  this_00 = &bindings[0].binding.name;
  bindings[0].binding._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Note: input data for in_v_attr:\n");
  local_218.m_format = (TextureFormat)iterate::attributes;
  local_1e0.m_format = (TextureFormat)0x7fd350;
  elemsStr<float_const*>
            ((string *)&reference,(Functional *)&local_218,(float **)&local_1e0,(float **)0x4,seed,
             in_R9D);
  std::operator<<((ostream *)this_00,(string *)&reference);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)bindings,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&reference);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reference,"in_v_attr",(allocator<char> *)&local_218);
  glu::va::Float(bindings,(string *)&reference,4,3,0,iterate::attributes);
  std::__cxx11::string::~string((string *)&reference);
  reference.m_format.order = RGB;
  reference.m_format.type = UNORM_INT8;
  reference.m_size.m_data[0] = 3;
  reference.m_size.m_data[2] = 0;
  reference._20_4_ = 0;
  glu::draw(context,program,1,bindings,(PrimitiveList *)&reference,(DrawUtilCallback *)0x0);
  getPixels(&pixels,context,&viewport);
  archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,(this->m_referenceImagePath)._M_dataplus._M_p,
             (allocator<char> *)&local_1e0);
  getPNG(&reference,archive,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  tcu::TextureLevel::getAccess(&local_218,&reference);
  tcu::Surface::getAccess(&local_1e0,&pixels);
  bVar1 = tcu::fuzzyCompare(log,"ImageComparison","Image Comparison",&local_218,&local_1e0,0.02,
                            COMPARE_LOG_RESULT);
  if (bVar1) {
    tcu::TextureLevel::~TextureLevel(&reference);
    tcu::Surface::~Surface(&pixels);
    std::__cxx11::string::~string((string *)&bindings[0].binding.name);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    tcu::TextureLevel::~TextureLevel(&reference);
    tcu::Surface::~Surface(&pixels);
    std::__cxx11::string::~string((string *)&bindings[0].binding.name);
    if (!bVar1) {
      return STOP;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

GLPositionCase::IterateResult GLPositionCase::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const deUint32			programGL				= m_program->getProgram();

	static const float attributes[3*4] =
	{
		-0.8f, -0.7f, 0.1f, 0.7f,
		-0.5f,  0.4f, 0.2f, 0.5f,
		 0.3f,  0.2f, 0.3f, 0.45f
	};

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 3);

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	log << TestLog::Message << "Note: input data for in_v_attr:\n" << arrayStr(attributes, 4) << TestLog::EndMessage;

	{
		const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 4, 3, 0, &attributes[0]) };
		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(bindings), &bindings[0], glu::pr::Patches(3));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}